

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O3

size_t chrono::utils::ChValidation::ReadDataFile
                 (string *filename,char delim,Headers *headers,Data *data)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pvVar3;
  char cVar4;
  difference_type dVar5;
  istream *piVar6;
  void *__s;
  long lVar7;
  size_type __new_size;
  long lVar8;
  long lVar9;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string line;
  string col_header;
  ifstream ifile;
  stringstream iss1;
  stringstream iss;
  size_t local_5a8;
  long local_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  value_type local_578;
  pointer local_558;
  pointer local_550;
  long local_548 [29];
  undefined8 auStack_460 [36];
  stringstream local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_548,(filename->_M_dataplus)._M_p,_S_in);
  local_598 = &local_588;
  local_590 = 0;
  local_588 = 0;
  local_340[0] = (stringstream)0xa;
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_460 + *(long *)(local_548[0] + -0x18));
  dVar5 = std::
          __count_if<std::istreambuf_iterator<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                             (ZEXT816(0xffffffff) << 0x40),(_Iter_equals_val<const_char>)local_340);
  std::istream::seekg((long)local_548,_S_beg);
  cVar4 = std::ios::widen((char)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_598,cVar4);
  cVar4 = std::ios::widen((char)(istream *)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_598,cVar4);
  cVar4 = std::ios::widen((char)(istream *)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_598,cVar4);
  std::__cxx11::stringstream::stringstream(local_340,(string *)&local_598,_S_out|_S_in);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
  lVar7 = dVar5 + -3;
  while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_340,(string *)&local_578,delim),
        ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(headers,&local_578);
  }
  pbVar1 = (headers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (headers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)pbVar2 - (long)pbVar1 >> 5;
  std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
            (data,__new_size);
  local_558 = pbVar2;
  local_550 = pbVar1;
  if (pbVar2 == pbVar1) {
    local_5a0 = __new_size + (__new_size == 0);
  }
  else {
    lVar8 = 8;
    local_5a0 = __new_size + (__new_size == 0);
    lVar9 = local_5a0;
    do {
      pvVar3 = (data->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __s = *(void **)((long)&pvVar3->_M_size + lVar8);
      if (*(long *)((long)pvVar3 + lVar8 + -8) != lVar7) {
        operator_delete(__s);
        *(long *)((long)pvVar3 + lVar8 + -8) = lVar7;
        __s = ::operator_new(lVar7 * 8);
        *(void **)((long)&pvVar3->_M_size + lVar8) = __s;
      }
      if (lVar7 != 0) {
        memset(__s,0,dVar5 * 8 - 0x18);
      }
      lVar8 = lVar8 + 0x10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  local_5a8 = 0;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)(istream *)local_548
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_548,(string *)&local_598,cVar4);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_598,_S_out|_S_in);
    lVar7 = local_5a0;
    if (local_558 != local_550) {
      do {
        std::istream::_M_extract<double>((double *)local_1b8);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    local_5a8 = local_5a8 + 1;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  if (local_598 != &local_588) {
    operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
  }
  std::ifstream::~ifstream(local_548);
  return local_5a8;
}

Assistant:

size_t ChValidation::ReadDataFile(const std::string& filename,
                                  char               delim,
                                  Headers&           headers,
                                  Data&              data)
{
  std::ifstream ifile(filename.c_str());
  std::string   line;

  // Count the number of lines in the file then rewind the input file stream.
  size_t num_lines = std::count(std::istreambuf_iterator<char>(ifile),
                                std::istreambuf_iterator<char>(), '\n');
  ifile.seekg(0, ifile.beg);

  size_t num_data_points = num_lines - 3;

  // Skip the first two lines.
  std::getline(ifile, line);
  std::getline(ifile, line);

  // Read the line with column headers.
  std::getline(ifile, line);
  std::stringstream iss1(line);
  std::string col_header = "";

  while (std::getline(iss1, col_header, delim))
    headers.push_back(col_header);

  size_t num_cols = headers.size();

  // Resize data
  data.resize(num_cols);
  for (size_t col = 0; col < num_cols; col++)
    data[col].resize(num_data_points);

  // Read the actual data, one line at a time.
  size_t row = 0;
  while (std::getline(ifile, line)) {
    std::stringstream iss(line);
    for (size_t col = 0; col < num_cols; col++)
      iss >> data[col][row];
    row++;
  }

  return row;
}